

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

void __thiscall
icu_63::Calendar::pinField(Calendar *this,UCalendarDateFields field,UErrorCode *status)

{
  int value;
  int iVar1;
  
  value = (*(this->super_UObject)._vptr_UObject[0x16])();
  iVar1 = (*(this->super_UObject)._vptr_UObject[0x15])(this,(ulong)field,status);
  if ((this->fFields[field] <= value) && (value = iVar1, iVar1 <= this->fFields[field])) {
    return;
  }
  set(this,field,value);
  return;
}

Assistant:

void Calendar::pinField(UCalendarDateFields field, UErrorCode& status) {
    int32_t max = getActualMaximum(field, status);
    int32_t min = getActualMinimum(field, status);

    if (fFields[field] > max) {
        set(field, max);
    } else if (fFields[field] < min) {
        set(field, min);
    }
}